

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::SparseDSATextureCommitmentTestCase::iterate(SparseDSATextureCommitmentTestCase *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ostream *poVar5;
  char *description;
  uint *puVar6;
  qpTestResult testResult;
  TestContext *this_01;
  int l;
  uint uVar7;
  uint *puVar8;
  GLuint texture;
  Functions *local_1e8;
  string *local_1e0;
  ostream *local_1d8;
  allocator<char> local_1d0 [32];
  undefined1 local_1b0 [384];
  Functions *pFVar4;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context)->
                     m_contextInfo,"GL_ARB_sparse_texture");
  if (bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context)->
                       m_contextInfo,"GL_EXT_direct_state_access");
    if (bVar1) {
      iVar2 = (*((this->super_SparseTextureCommitmentTestCase).super_TestCase.m_context)->
                m_renderCtx->_vptr_RenderContext[3])();
      pFVar4 = (Functions *)CONCAT44(extraout_var,iVar2);
      local_1e0 = (string *)&(this->super_SparseTextureCommitmentTestCase).field_0x90;
      local_1d8 = (ostream *)&(this->super_SparseTextureCommitmentTestCase).field_0x88;
      local_1e8 = pFVar4;
      for (puVar8 = (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          puVar8 != (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedTargets.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish; puVar8 = puVar8 + 1) {
        puVar6 = (uint *)(this->super_SparseTextureCommitmentTestCase).mSupportedInternalFormats.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
LAB_00ad6ed9:
        if (puVar6 != (uint *)(this->super_SparseTextureCommitmentTestCase).
                              mSupportedInternalFormats.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b0,glcts::fixed_sample_locations_values + 1,local_1d0);
          std::__cxx11::stringbuf::str(local_1e0);
          std::__cxx11::string::~string((string *)local_1b0);
          poVar5 = std::operator<<(local_1d8,"Testing DSA sparse texture commitment for target: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*puVar8);
          poVar5 = std::operator<<(poVar5,", format: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,*puVar6);
          std::operator<<(poVar5," - ");
          (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[8])(this,pFVar4,(ulong)*puVar8,(ulong)*puVar6,&texture,3);
          uVar7 = 0;
          uVar3 = 1;
          do {
            if ((this->super_SparseTextureCommitmentTestCase).mState.levels <= (int)uVar7) break;
            iVar2 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                      super_TestNode._vptr_TestNode[0xc])
                              (this,local_1e8,(ulong)*puVar8,(ulong)*puVar6,&texture,(ulong)uVar7);
            pFVar4 = local_1e8;
            if ((char)iVar2 != '\0') {
              (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                super_TestNode._vptr_TestNode[10])
                        (this,local_1e8,(ulong)*puVar8,(ulong)*puVar6,&texture,(ulong)uVar7);
              uVar3 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                        super_TestNode._vptr_TestNode[0xb])
                                (this,pFVar4,(ulong)*puVar8,(ulong)*puVar6,&texture,(ulong)uVar7);
            }
            uVar7 = uVar7 + 1;
          } while ((uVar3 & 1) != 0);
          pFVar4 = local_1e8;
          gl4cts::Texture::Delete(local_1e8,&texture);
          if (((uVar3 & 1) != 0) &&
             (iVar2 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                        super_TestNode._vptr_TestNode[0xf])
                                (this,pFVar4,(ulong)*puVar8,(ulong)*puVar6,&texture),
             (char)iVar2 != '\0')) goto code_r0x00ad7028;
          goto LAB_00ad7073;
        }
      }
      this_01 = (this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
                super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00ad70e9;
    }
    this_01 = (this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "GL_EXT_direct_state_access extension is not supported.";
  }
  else {
    this_01 = (this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Not Supported";
  }
  testResult = QP_TEST_RESULT_NOT_SUPPORTED;
LAB_00ad70e9:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
code_r0x00ad7028:
  iVar2 = (*(this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[0x10])(this,pFVar4,(ulong)*puVar8,(ulong)*puVar6,&texture)
  ;
  puVar6 = puVar6 + 1;
  if ((char)iVar2 == '\0') {
LAB_00ad7073:
    local_1b0._0_8_ =
         ((this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.super_TestNode
         .m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)this_00,(string *)local_1d0);
    std::operator<<((ostream *)this_00,"Fail");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    this_01 = (this->super_SparseTextureCommitmentTestCase).super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
    goto LAB_00ad70e9;
  }
  goto LAB_00ad6ed9;
}

Assistant:

tcu::TestNode::IterateResult SparseDSATextureCommitmentTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_direct_state_access"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_EXT_direct_state_access extension is not supported.");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			mLog.str("");
			mLog << "Testing DSA sparse texture commitment for target: " << target << ", format: " << format << " - ";

			//Checking if written data into committed region is as expected
			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = verifyTextureData(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			//verify errors
			result = result && verifyInvalidOperationErrors(gl, target, format, texture);
			result = result && verifyInvalidValueErrors(gl, target, format, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}